

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

void __thiscall HN::State::requestJSONForURI(State *this,string *uri)

{
  undefined8 uVar1;
  string *in_RSI;
  long in_RDI;
  string local_30 [48];
  
  uVar1 = std::__cxx11::string::c_str();
  snprintf((char *)(in_RDI + 0xa8),0x200,"%s",uVar1);
  std::__cxx11::string::string(local_30,in_RSI);
  requestJSONForURI_impl((string *)0x119ebe);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void State::requestJSONForURI(std::string uri) {
        snprintf(curURI, 512, "%s", uri.c_str());

        requestJSONForURI_impl(std::move(uri));
    }